

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

void sunPrintTimer(SUNHashMapKeyValue kv,FILE *fp,void *pvoid)

{
  double dVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  long in_RDX;
  FILE *in_RSI;
  undefined8 *in_RDI;
  double percent;
  double average;
  double maximum;
  sunTimerStruct *ts;
  SUNProfiler p;
  double local_48;
  
  lVar3 = in_RDI[1];
  dVar1 = *(double *)(lVar3 + 0x18);
  uVar2 = *(undefined8 *)(lVar3 + 0x10);
  iVar4 = strcmp((char *)*in_RDI,"From profiler epoch");
  if (iVar4 == 0) {
    local_48 = 100.0;
  }
  else {
    local_48 = (dVar1 / *(double *)(in_RDX + 0x20)) * 100.0;
  }
  fprintf(in_RSI,"%-40s\t %6.2f%% \t         %.6fs \t %.6fs \t %ld\n",local_48,dVar1,uVar2,*in_RDI,
          *(undefined8 *)(lVar3 + 0x28));
  return;
}

Assistant:

void sunPrintTimer(SUNHashMapKeyValue kv, FILE* fp, void* pvoid)
{
  SUNProfiler p      = (SUNProfiler)pvoid;
  sunTimerStruct* ts = (sunTimerStruct*)kv->value;
  double maximum     = ts->maximum;
  double average     = ts->average;
  double percent = strcmp((const char*)kv->key, (const char*)SUNDIALS_ROOT_TIMER)
                     ? maximum / p->sundials_time * 100
                     : 100;
  fprintf(fp, "%-40s\t %6.2f%% \t         %.6fs \t %.6fs \t %ld\n", kv->key,
          percent, maximum, average, ts->count);
}